

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

void udp_ep_close(void *arg)

{
  nni_aio *aio;
  
  nni_aio_close((nni_aio *)((long)arg + 0x220));
  nni_aio_close((nni_aio *)((long)arg + 0x658));
  nni_aio_close((nni_aio *)((long)arg + 0x58));
  nni_mtx_lock((nni_mtx *)((long)arg + 8));
  aio = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x9f0));
  while (aio != (nni_aio *)0x0) {
    nni_aio_list_remove(aio);
    nni_aio_finish_error(aio,NNG_ECONNABORTED);
    aio = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x9f0));
  }
  nni_mtx_unlock((nni_mtx *)((long)arg + 8));
  return;
}

Assistant:

static void
udp_ep_close(void *arg)
{
	udp_ep  *ep = arg;
	nni_aio *aio;

	nni_aio_close(&ep->resaio);
	nni_aio_close(&ep->rx_aio);
	nni_aio_close(&ep->timeaio);

	// leave tx open so we can send disconnects

	nni_mtx_lock(&ep->mtx);
	while ((aio = nni_list_first(&ep->connaios)) != NULL) {
		nni_aio_list_remove(aio);
		nni_aio_finish_error(aio, NNG_ECONNABORTED);
	}
	nni_mtx_unlock(&ep->mtx);
}